

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96_test.c
# Opt level: O0

void brngCTRXStepR(void *buf,size_t count,void *stack)

{
  long in_RDX;
  void *in_RSI;
  void *unaff_retaddr;
  size_t count1;
  octet *buf1;
  brng_ctrx_st *s;
  void *in_stack_ffffffffffffffc8;
  
  while (in_RSI != (void *)0x0) {
    if (in_RSI < (void *)(*(long *)(in_RDX + 8) - *(long *)(in_RDX + 0x10))) {
      memCopy(in_RSI,in_stack_ffffffffffffffc8,0x113159);
      *(long *)(in_RDX + 0x10) = (long)in_RSI + *(long *)(in_RDX + 0x10);
      in_RSI = (void *)0x0;
    }
    else {
      memCopy(in_RSI,in_stack_ffffffffffffffc8,0x1131a3);
      in_RSI = (void *)((long)in_RSI - (*(long *)(in_RDX + 8) - *(long *)(in_RDX + 0x10)));
      *(undefined8 *)(in_RDX + 0x10) = 0;
    }
  }
  brngCTRStepR(buf1,count1,unaff_retaddr);
  return;
}

Assistant:

static void brngCTRXStepR(void* buf, size_t count, void* stack)
{
	brng_ctrx_st* s = (brng_ctrx_st*)stack;
	octet* buf1 = (octet*)buf;
	size_t count1 = count;
	ASSERT(memIsValid(s, sizeof(brng_ctrx_st)));
	// заполнить buf
	while (count1)
		if (count1 < s->count - s->offset)
		{
			memCopy(buf1, s->X + s->offset, count1);
			s->offset += count1;
			count1 = 0;
		}
		else
		{
			memCopy(buf1, s->X + s->offset, s->count - s->offset);
			buf1 += s->count - s->offset;
			count1 -= s->count - s->offset;
			s->offset = 0;
		}
	// сгенерировать
	brngCTRStepR(buf, count, s->state_ex);
}